

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O1

Utest * __thiscall
TEST_WiningStateTest_Not_OneShot_ReadyOnly_TestShell::createTest
          (TEST_WiningStateTest_Not_OneShot_ReadyOnly_TestShell *this)

{
  TEST_WiningStateTest_Not_OneShot_ReadyOnly_Test *this_00;
  
  this_00 = (TEST_WiningStateTest_Not_OneShot_ReadyOnly_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
                         ,0x88);
  TEST_WiningStateTest_Not_OneShot_ReadyOnly_Test::TEST_WiningStateTest_Not_OneShot_ReadyOnly_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(WiningStateTest, Not_OneShot_ReadyOnly)
{
	addNoWiningHand();

	SelfDrawnSituation situation;
	situation.is_one_shot = true;

	selfDrawn(situation);
	auto r = c.report();

	CHECK_EQUAL(0, r.patterns.count(Pattern::OneShot));
}